

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  size_type sVar2;
  ulong uVar3;
  Value *src;
  bool bVar4;
  string *this_00;
  MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *pMVar5;
  ValueMapEntryAccessorType *dest;
  uint size;
  char *ptr_00;
  undefined8 *puVar6;
  pair<const_char_*,_int> pVar7;
  char *local_50;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
  local_48;
  
  local_50 = ptr;
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
  if (bVar4) {
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_50 == '\n') {
    bVar1 = local_50[1];
    size = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar7 = ReadSizeFallback(local_50 + 1,(uint)bVar1);
      size = pVar7.second;
      ptr_00 = pVar7.first;
      if (ptr_00 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      ptr_00 = local_50 + 2;
    }
    s = &this->key_;
    local_50 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,ptr_00,size,s);
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar4 = WireFormatLite::VerifyUtf8String
                      ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                       "CoreML.Specification.MILSpec.TensorType.AttributesEntry.key");
    if (!bVar4) {
      return (char *)0x0;
    }
    bVar4 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
    if (bVar4) {
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_00135cc2:
      pMVar5 = (MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *)Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse>
                            ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar5;
    }
    else {
      if (*local_50 != '\x12') goto LAB_00135cc2;
      sVar2 = (this->map_->elements_).num_elements_;
      Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::InnerMap::
      insert<std::__cxx11::string&>(&local_48,this->map_,s);
      this->value_ptr_ = (Value *)&(local_48.first.node_)->field_0x20;
      if (sVar2 == (this->map_->elements_).num_elements_) goto LAB_00135cc2;
      local_50 = ParseContext::ParseMessage
                           (ctx,(MessageLite *)&(local_48.first.node_)->field_0x20,local_50 + 1);
      if (local_50 == (char *)0x0) {
        Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::erase<std::__cxx11::string>
                  ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)this->map_,s);
        return (char *)0x0;
      }
      bVar4 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
      if (bVar4) {
        return local_50;
      }
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      pMVar5 = (MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *)Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse>
                            ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar5;
      src = this->value_ptr_;
      dest = mutable_value(pMVar5);
      MoveHelper<false,_true,_true,_CoreML::Specification::MILSpec::Value>::Move(src,dest);
      Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::erase<std::__cxx11::string>
                ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)this->map_,s);
      pMVar5 = this->entry_;
    }
    *(byte *)pMVar5->_has_bits_ = (byte)pMVar5->_has_bits_[0] | 1;
    uVar3 = (((MapEntryLite<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
               *)&pMVar5->super_MessageLite)->
            super_MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ).super_MessageLite._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    this_00 = ArenaStringPtr::Mutable_abi_cxx11_(&pMVar5->key_,puVar6);
    std::__cxx11::string::operator=((string *)this_00,(string *)s);
    pMVar5 = this->entry_;
    goto LAB_00135d04;
  }
  pMVar5 = (MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            *)Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse>
                        ((this->mf_->map_).elements_.alloc_.arena_);
  this->entry_ = pMVar5;
LAB_00135d04:
  local_50 = MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
             ::_InternalParse(pMVar5,local_50,ctx);
  if (local_50 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_50;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }